

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  EventLoop *this;
  unsigned_short uVar1;
  LogLevel LVar2;
  sz_pid_t sVar3;
  sz_sock sVar4;
  LogStream *pLVar5;
  self *psVar6;
  SourceFile file;
  sz_sock local_11d4;
  code *local_11d0;
  _Bind<void_(*(int,_std::_Placeholder<1>))(int,_sznet::Timestamp)> local_11c8;
  ReadEventCallback local_11b8;
  undefined1 local_1198 [8];
  Channel channel;
  Socket sock;
  InetAddress bindAddr;
  EventLoop loop;
  undefined1 local_ff8 [12];
  Logger local_fe8;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  LVar2 = sznet::Logger::logLevel();
  if ((int)LVar2 < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_ff8,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    sznet::Logger::Logger(&local_fe8,file,0x4a);
    pLVar5 = sznet::Logger::stream(&local_fe8);
    psVar6 = sznet::LogStream::operator<<(pLVar5,"pid = ");
    sVar3 = sznet::sz_getpid();
    pLVar5 = sznet::LogStream::operator<<(psVar6,sVar3);
    psVar6 = sznet::LogStream::operator<<(pLVar5,", tid = ");
    sVar3 = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar6,sVar3);
    sznet::Logger::~Logger(&local_fe8);
  }
  this = (EventLoop *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc);
  sznet::net::EventLoop::EventLoop(this);
  g_pLoopsRun = this;
  sznet::net::InetAddress::InetAddress((InetAddress *)&sock,0x7e7,false,false);
  uVar1 = sznet::net::InetAddress::family((InetAddress *)&sock);
  sVar4 = sznet::net::sockets::sz_udp_create((uint)uVar1);
  sznet::net::Socket::Socket((Socket *)((long)&channel.m_errorCallback._M_invoker + 4),sVar4,true);
  sVar4 = sznet::net::Socket::fd((Socket *)((long)&channel.m_errorCallback._M_invoker + 4));
  sznet::net::sockets::sz_sock_setnonblock(sVar4,true);
  sznet::net::Socket::bindAddress
            ((Socket *)((long)&channel.m_errorCallback._M_invoker + 4),(InetAddress *)&sock);
  sVar4 = sznet::net::Socket::fd((Socket *)((long)&channel.m_errorCallback._M_invoker + 4));
  sznet::net::Channel::Channel
            ((Channel *)local_1198,
             (EventLoop *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc),sVar4);
  local_11d0 = UdpServerReadCallback;
  local_11d4 = sznet::net::Socket::fd((Socket *)((long)&channel.m_errorCallback._M_invoker + 4));
  std::bind<void(*)(int,sznet::Timestamp),int,std::_Placeholder<1>const&>
            (&local_11c8._M_f,(int *)&local_11d0,(_Placeholder<1> *)&local_11d4);
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(*(int,std::_Placeholder<1>))(int,sznet::Timestamp)>,void>
            ((function<void(sznet::Timestamp)> *)&local_11b8,&local_11c8);
  sznet::net::Channel::setReadCallback((Channel *)local_1198,&local_11b8);
  std::function<void_(sznet::Timestamp)>::~function(&local_11b8);
  sznet::net::Channel::enableReading((Channel *)local_1198);
  sznet::net::EventLoop::loop
            ((EventLoop *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc));
  argv_local._4_4_ = 0;
  sznet::net::Channel::~Channel((Channel *)local_1198);
  sznet::net::Socket::~Socket((Socket *)((long)&channel.m_errorCallback._M_invoker + 4));
  sznet::net::EventLoop::~EventLoop
            ((EventLoop *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();

    EventLoop loop;
    g_pLoopsRun = &loop;
    InetAddress bindAddr(2023);
    Socket sock(sockets::sz_udp_create(bindAddr.family()));
    sockets::sz_sock_setnonblock(sock.fd(), true);
    sock.bindAddress(bindAddr);
    Channel channel(&loop, sock.fd());
    channel.setReadCallback(std::bind(&UdpServerReadCallback, sock.fd(), std::placeholders::_1));
    channel.enableReading();

    loop.loop();

    return 0;
}